

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void loadlc(int offset,int pos)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  char cVar6;
  
  uVar3 = 0x10;
  if (pos == 0) {
    if (bank < 0xf0) {
      uVar2 = (uint)(pos != 0) * 9 + 7;
      lVar5 = 0;
      uVar4 = bank;
      do {
        cVar1 = (char)(uVar4 & 0xf);
        cVar6 = cVar1 + '0';
        if (9 < (uVar4 & 0xf)) {
          cVar6 = cVar1 + '7';
        }
        prlnbuf[lVar5 + 8] = cVar6;
        uVar4 = (int)uVar4 >> 4;
        lVar5 = lVar5 + -1;
      } while (lVar5 != -2);
    }
    else {
      prlnbuf[7] = '-';
      prlnbuf[8] = '-';
      uVar2 = 9;
    }
    uVar3 = (ulong)(uVar2 + 1);
    prlnbuf[uVar2] = ':';
    offset = offset + page * 0x2000;
  }
  lVar5 = 4;
  do {
    cVar1 = (char)(offset & 0xfU);
    cVar6 = cVar1 + '0';
    if (9 < (offset & 0xfU)) {
      cVar6 = cVar1 + '7';
    }
    (&DAT_00329ebf)[lVar5 + uVar3] = cVar6;
    offset = offset >> 4;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  return;
}

Assistant:

void
loadlc(int offset, int pos)
{
	int	i;

	if (pos)
		i = 16;
	else
		i = 7;

	if (pos == 0) {
		if (bank >= RESERVED_BANK) {
			prlnbuf[i++] = '-';
			prlnbuf[i++] = '-';
		}
		else {
			hexcon(2, bank, &prlnbuf[i]);
		}
		prlnbuf[i++] = ':';
		offset += page << 13;
	}
	hexcon(4, offset, &prlnbuf[i]);
}